

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

void set_tx_size_search_method
               (AV1_COMMON *cm,WinnerModeParams *winner_mode_params,TxfmSearchParams *txfm_params,
               int enable_winner_mode_for_tx_size_srch,int is_winner_mode)

{
  TX_MODE TVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int in_R8D;
  
  *(undefined1 *)(in_RDX + 0x18) = *(undefined1 *)(in_RSI + 0x18);
  if (in_ECX != 0) {
    if (in_R8D == 0) {
      *(undefined1 *)(in_RDX + 0x18) = *(undefined1 *)(in_RSI + 0x19);
    }
    else {
      *(undefined1 *)(in_RDX + 0x18) = *(undefined1 *)(in_RSI + 0x1a);
    }
  }
  TVar1 = select_tx_mode(in_RDI,*(TX_SIZE_SEARCH_METHOD *)(in_RDX + 0x18));
  *(TX_MODE *)(in_RDX + 0x24) = TVar1;
  return;
}

Assistant:

static inline void set_tx_size_search_method(
    const AV1_COMMON *cm, const WinnerModeParams *winner_mode_params,
    TxfmSearchParams *txfm_params, int enable_winner_mode_for_tx_size_srch,
    int is_winner_mode) {
  // Populate transform size search method/transform mode appropriately
  txfm_params->tx_size_search_method =
      winner_mode_params->tx_size_search_methods[DEFAULT_EVAL];
  if (enable_winner_mode_for_tx_size_srch) {
    if (is_winner_mode)
      txfm_params->tx_size_search_method =
          winner_mode_params->tx_size_search_methods[WINNER_MODE_EVAL];
    else
      txfm_params->tx_size_search_method =
          winner_mode_params->tx_size_search_methods[MODE_EVAL];
  }
  txfm_params->tx_mode_search_type =
      select_tx_mode(cm, txfm_params->tx_size_search_method);
}